

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_function_list_helper.hpp
# Opt level: O1

void duckdb::FillFunctionParameters
               (FunctionDescription *function_description,char *function_name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *parameters,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *descriptions)

{
  pointer pbVar1;
  long lVar2;
  reference pvVar3;
  InternalException *this;
  pointer input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  parameter_name_type;
  string local_70;
  char *local_50;
  long local_48;
  long local_40;
  
  input = (parameters->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (parameters->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (input != pbVar1) {
    local_50 = function_name;
    do {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"::","");
      StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)&local_48,(string *)input,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      lVar2 = local_40 - local_48 >> 5;
      if (lVar2 == 2) {
        pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)&local_48,0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &function_description->parameter_names,pvVar3);
        pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)&local_48,1);
        DBConfig::ParseLogicalType((LogicalType *)&local_70,pvVar3);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalType>
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   function_description,(LogicalType *)&local_70);
      }
      else {
        if (lVar2 != 1) {
          this = (InternalException *)__cxa_allocate_exception(0x10);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"Ill formed function variant for function \'%s\'","");
          InternalException::InternalException<char_const*>(this,(string *)&local_70,local_50);
          __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)&local_48,0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &function_description->parameter_names,pvVar3);
        LogicalType::LogicalType((LogicalType *)&local_70,ANY);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalType>
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   function_description,(LogicalType *)&local_70);
      }
      LogicalType::~LogicalType((LogicalType *)&local_70);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      input = (pointer)((string *)input + 1);
    } while (input != pbVar1);
  }
  return;
}

Assistant:

static void FillFunctionParameters(FunctionDescription &function_description, const char *function_name,
                                   vector<string> &parameters, vector<string> &descriptions) {
	for (string &parameter : parameters) {
		vector<string> parameter_name_type = StringUtil::Split(parameter, "::");
		if (parameter_name_type.size() == 1) {
			function_description.parameter_names.push_back(std::move(parameter_name_type[0]));
			function_description.parameter_types.push_back(LogicalType::ANY);
		} else if (parameter_name_type.size() == 2) {
			function_description.parameter_names.push_back(std::move(parameter_name_type[0]));
			function_description.parameter_types.push_back(DBConfig::ParseLogicalType(parameter_name_type[1]));
		} else {
			throw InternalException("Ill formed function variant for function '%s'", function_name);
		}
	}
}